

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O3

int dotwoweapon(void)

{
  obj *obj;
  schar sVar1;
  int iVar2;
  uint uVar3;
  
  if (u.twoweap == '\0') {
    iVar2 = can_twoweapon();
    if (iVar2 == 0) {
      uVar3 = 0;
    }
    else {
      pline("You begin two-weapon combat.");
      u.twoweap = '\x01';
      setworn(uswapwep,0x400);
      update_inventory();
      update_inventory();
      uVar3 = mt_random();
      sVar1 = acurr(3);
      uVar3 = (uint)((int)sVar1 <= (int)(uVar3 % 0x14));
    }
  }
  else {
    uVar3 = 0;
    pline("You switch to your primary weapon.");
    obj = uswapwep;
    u.twoweap = '\0';
    setworn((obj *)0x0,0x400);
    update_inventory();
    setworn(obj,0x400);
    update_inventory();
    update_inventory();
  }
  return uVar3;
}

Assistant:

int dotwoweapon(void)
{
	/* You can always toggle it off */
	if (u.twoweap) {
		struct obj *tmp;
		pline("You switch to your primary weapon.");
		tmp = uswapwep;
		u.twoweap = 0;
		setuswapwep(NULL);
		setuswapwep(tmp);
		update_inventory();
		return 0;
	}

	/* May we use two weapons? */
	if (can_twoweapon()) {
		/* Success! */
		pline("You begin two-weapon combat.");
		u.twoweap = 1;
		setuswapwep(uswapwep);
		update_inventory();
		return rnd(20) > ACURR(A_DEX);
	}
	return 0;
}